

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDSectorType::SectorEdgeCountFromFaceCount
               (ON_SubDVertexTag vertex_tag,uint sector_face_count)

{
  if (sector_face_count - 1 < 0xfff0) {
    return ((vertex_tag & ~Smooth) == Crease) + sector_face_count;
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::SectorEdgeCountFromFaceCount(
  ON_SubDVertexTag vertex_tag,
  unsigned int sector_face_count
  )
{
  if (sector_face_count > 0 && sector_face_count <= ON_SubDVertex::MaximumFaceCount)
  {
    unsigned int sector_edge_count
      = (ON_SubDVertexTag::Crease == vertex_tag || ON_SubDVertexTag::Corner == vertex_tag)
      ? sector_face_count+1
      : sector_face_count;
    return sector_edge_count;
  }
  return ON_SUBD_RETURN_ERROR(0);
}